

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O3

ROMInfo ** MT32Emu::ROMInfo::getFullROMInfos(Bit32u *itemCount)

{
  long lVar1;
  undefined **ppuVar2;
  undefined8 *puVar3;
  
  if (itemCount == (Bit32u *)0x0) {
    if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
      getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
      getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
      getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
      getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
      getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
      getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
      getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
      ppuVar2 = &getROMInfoLists()::FULL_ROM_INFOS;
      puVar3 = &getROMInfoLists()::ALL_ROM_INFOS;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
      ppuVar2 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
      puVar3 = &DAT_001359d0;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
    }
  }
  else {
    if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
      getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
      getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
      getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
      getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
      getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
      getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
      getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
      ppuVar2 = &getROMInfoLists()::FULL_ROM_INFOS;
      puVar3 = &getROMInfoLists()::ALL_ROM_INFOS;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
      ppuVar2 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
      puVar3 = &DAT_001359d0;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *ppuVar2;
        ppuVar2 = ppuVar2 + 1;
        puVar3 = puVar3 + 1;
      }
    }
    *itemCount = 0xe;
  }
  return (ROMInfo **)&getROMInfoLists()::FULL_ROM_INFOS;
}

Assistant:

static const ROMInfoLists &getROMInfoLists() {
	static const File::SHA1Digest CTRL_MT32_V1_04_A_SHA1 = "9cd4858014c4e8a9dff96053f784bfaac1092a2e";
	static const File::SHA1Digest CTRL_MT32_V1_04_B_SHA1 = "fe8db469b5bfeb37edb269fd47e3ce6d91014652";
	static const File::SHA1Digest CTRL_MT32_V1_04_SHA1 = "5a5cb5a77d7d55ee69657c2f870416daed52dea7";
	static const File::SHA1Digest CTRL_MT32_V1_05_A_SHA1 = "57a09d80d2f7ca5b9734edbe9645e6e700f83701";
	static const File::SHA1Digest CTRL_MT32_V1_05_B_SHA1 = "52e3c6666db9ef962591a8ee99be0cde17f3a6b6";
	static const File::SHA1Digest CTRL_MT32_V1_05_SHA1 = "e17a3a6d265bf1fa150312061134293d2b58288c";
	static const File::SHA1Digest CTRL_MT32_V1_06_A_SHA1 = "cc83bf23cee533097fb4c7e2c116e43b50ebacc8";
	static const File::SHA1Digest CTRL_MT32_V1_06_B_SHA1 = "bf4f15666bc46679579498386704893b630c1171";
	static const File::SHA1Digest CTRL_MT32_V1_06_SHA1 = "a553481f4e2794c10cfe597fef154eef0d8257de";
	static const File::SHA1Digest CTRL_MT32_V1_07_A_SHA1 = "13f06b38f0d9e0fc050b6503ab777bb938603260";
	static const File::SHA1Digest CTRL_MT32_V1_07_B_SHA1 = "c55e165487d71fa88bd8c5e9c083bc456c1a89aa";
	static const File::SHA1Digest CTRL_MT32_V1_07_SHA1 = "b083518fffb7f66b03c23b7eb4f868e62dc5a987";
	static const File::SHA1Digest CTRL_MT32_BLUER_A_SHA1 = "11a6ae5d8b6ee328b371af7f1e40b82125aa6b4d";
	static const File::SHA1Digest CTRL_MT32_BLUER_B_SHA1 = "e0934320d7cbb5edfaa29e0d01ae835ef620085b";
	static const File::SHA1Digest CTRL_MT32_BLUER_SHA1 = "7b8c2a5ddb42fd0732e2f22b3340dcf5360edf92";

	static const File::SHA1Digest CTRL_MT32_V2_03_SHA1 = "5837064c9df4741a55f7c4d8787ac158dff2d3ce";
	static const File::SHA1Digest CTRL_MT32_V2_04_SHA1 = "2c16432b6c73dd2a3947cba950a0f4c19d6180eb";
	static const File::SHA1Digest CTRL_MT32_V2_06_SHA1 = "2869cf4c235d671668cfcb62415e2ce8323ad4ed";
	static const File::SHA1Digest CTRL_MT32_V2_07_SHA1 = "47b52adefedaec475c925e54340e37673c11707c";
	static const File::SHA1Digest CTRL_CM32L_V1_00_SHA1 = "73683d585cd6948cc19547942ca0e14a0319456d";
	static const File::SHA1Digest CTRL_CM32L_V1_02_SHA1 = "a439fbb390da38cada95a7cbb1d6ca199cd66ef8";
	static const File::SHA1Digest CTRL_CM32LN_V1_00_SHA1 = "dc1c5b1b90a4646d00f7daf3679733c7badc7077";

	static const File::SHA1Digest PCM_MT32_L_SHA1 = "3a1e19b0cd4036623fd1d1d11f5f25995585962b";
	static const File::SHA1Digest PCM_MT32_H_SHA1 = "2cadb99d21a6a4a6f5b61b6218d16e9b43f61d01";
	static const File::SHA1Digest PCM_MT32_SHA1 = "f6b1eebc4b2d200ec6d3d21d51325d5b48c60252";
	static const File::SHA1Digest PCM_CM32L_H_SHA1 = "3ad889fde5db5b6437cbc2eb6e305312fec3df93";
	static const File::SHA1Digest PCM_CM32L_SHA1 = "289cc298ad532b702461bfc738009d9ebe8025ea";

	static ROMInfo CTRL_MT32_V1_04_A = {32768, CTRL_MT32_V1_04_A_SHA1, ROMInfo::Control, "ctrl_mt32_1_04_a", "MT-32 Control v1.04", ROMInfo::Mux0, NULL};
	static ROMInfo CTRL_MT32_V1_04_B = {32768, CTRL_MT32_V1_04_B_SHA1, ROMInfo::Control, "ctrl_mt32_1_04_b", "MT-32 Control v1.04", ROMInfo::Mux1, &CTRL_MT32_V1_04_A};
	static ROMInfo CTRL_MT32_V1_04 = {65536, CTRL_MT32_V1_04_SHA1, ROMInfo::Control, "ctrl_mt32_1_04", "MT-32 Control v1.04", ROMInfo::Full, NULL};
	static ROMInfo CTRL_MT32_V1_05_A = {32768, CTRL_MT32_V1_05_A_SHA1, ROMInfo::Control, "ctrl_mt32_1_05_a", "MT-32 Control v1.05", ROMInfo::Mux0, NULL};
	static ROMInfo CTRL_MT32_V1_05_B = {32768, CTRL_MT32_V1_05_B_SHA1, ROMInfo::Control, "ctrl_mt32_1_05_b", "MT-32 Control v1.05", ROMInfo::Mux1, &CTRL_MT32_V1_05_A};
	static ROMInfo CTRL_MT32_V1_05 = {65536, CTRL_MT32_V1_05_SHA1, ROMInfo::Control, "ctrl_mt32_1_05", "MT-32 Control v1.05", ROMInfo::Full, NULL};
	static ROMInfo CTRL_MT32_V1_06_A = {32768, CTRL_MT32_V1_06_A_SHA1, ROMInfo::Control, "ctrl_mt32_1_06_a", "MT-32 Control v1.06", ROMInfo::Mux0, NULL};
	static ROMInfo CTRL_MT32_V1_06_B = {32768, CTRL_MT32_V1_06_B_SHA1, ROMInfo::Control, "ctrl_mt32_1_06_b", "MT-32 Control v1.06", ROMInfo::Mux1, &CTRL_MT32_V1_06_A};
	static ROMInfo CTRL_MT32_V1_06 = {65536, CTRL_MT32_V1_06_SHA1, ROMInfo::Control, "ctrl_mt32_1_06", "MT-32 Control v1.06", ROMInfo::Full, NULL};
	static ROMInfo CTRL_MT32_V1_07_A = {32768, CTRL_MT32_V1_07_A_SHA1, ROMInfo::Control, "ctrl_mt32_1_07_a", "MT-32 Control v1.07", ROMInfo::Mux0, NULL};
	static ROMInfo CTRL_MT32_V1_07_B = {32768, CTRL_MT32_V1_07_B_SHA1, ROMInfo::Control, "ctrl_mt32_1_07_b", "MT-32 Control v1.07", ROMInfo::Mux1, &CTRL_MT32_V1_07_A};
	static ROMInfo CTRL_MT32_V1_07 = {65536, CTRL_MT32_V1_07_SHA1, ROMInfo::Control, "ctrl_mt32_1_07", "MT-32 Control v1.07", ROMInfo::Full, NULL};
	static ROMInfo CTRL_MT32_BLUER_A = {32768, CTRL_MT32_BLUER_A_SHA1, ROMInfo::Control, "ctrl_mt32_bluer_a", "MT-32 Control BlueRidge", ROMInfo::Mux0, NULL};
	static ROMInfo CTRL_MT32_BLUER_B = {32768, CTRL_MT32_BLUER_B_SHA1, ROMInfo::Control, "ctrl_mt32_bluer_b", "MT-32 Control BlueRidge", ROMInfo::Mux1, &CTRL_MT32_BLUER_A};
	static ROMInfo CTRL_MT32_BLUER = {65536, CTRL_MT32_BLUER_SHA1, ROMInfo::Control, "ctrl_mt32_bluer", "MT-32 Control BlueRidge", ROMInfo::Full, NULL};

	static const ROMInfo CTRL_MT32_V2_03 = {131072, CTRL_MT32_V2_03_SHA1, ROMInfo::Control, "ctrl_mt32_2_03", "MT-32 Control v2.03", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_MT32_V2_04 = {131072, CTRL_MT32_V2_04_SHA1, ROMInfo::Control, "ctrl_mt32_2_04", "MT-32 Control v2.04", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_MT32_V2_06 = {131072, CTRL_MT32_V2_06_SHA1, ROMInfo::Control, "ctrl_mt32_2_06", "MT-32 Control v2.06", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_MT32_V2_07 = {131072, CTRL_MT32_V2_07_SHA1, ROMInfo::Control, "ctrl_mt32_2_07", "MT-32 Control v2.07", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_CM32L_V1_00 = {65536, CTRL_CM32L_V1_00_SHA1, ROMInfo::Control, "ctrl_cm32l_1_00", "CM-32L/LAPC-I Control v1.00", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_CM32L_V1_02 = {65536, CTRL_CM32L_V1_02_SHA1, ROMInfo::Control, "ctrl_cm32l_1_02", "CM-32L/LAPC-I Control v1.02", ROMInfo::Full, NULL};
	static const ROMInfo CTRL_CM32LN_V1_00 = {65536, CTRL_CM32LN_V1_00_SHA1, ROMInfo::Control, "ctrl_cm32ln_1_00", "CM-32LN/CM-500/LAPC-N Control v1.00", ROMInfo::Full, NULL};

	static ROMInfo PCM_MT32_L = {262144, PCM_MT32_L_SHA1, ROMInfo::PCM, "pcm_mt32_l", "MT-32 PCM ROM", ROMInfo::FirstHalf, NULL};
	static ROMInfo PCM_MT32_H = {262144, PCM_MT32_H_SHA1, ROMInfo::PCM, "pcm_mt32_h", "MT-32 PCM ROM", ROMInfo::SecondHalf, &PCM_MT32_L};
	static ROMInfo PCM_MT32 = {524288, PCM_MT32_SHA1, ROMInfo::PCM, "pcm_mt32", "MT-32 PCM ROM", ROMInfo::Full, NULL};
	// Alias of PCM_MT32 ROM, only useful for pairing with PCM_CM32L_H.
	static ROMInfo PCM_CM32L_L = {524288, PCM_MT32_SHA1, ROMInfo::PCM, "pcm_cm32l_l", "CM-32L/CM-64/LAPC-I PCM ROM", ROMInfo::FirstHalf, NULL};
	static ROMInfo PCM_CM32L_H = {524288, PCM_CM32L_H_SHA1, ROMInfo::PCM, "pcm_cm32l_h", "CM-32L/CM-64/LAPC-I PCM ROM", ROMInfo::SecondHalf, &PCM_CM32L_L};
	static ROMInfo PCM_CM32L = {1048576, PCM_CM32L_SHA1, ROMInfo::PCM, "pcm_cm32l", "CM-32L/CM-64/LAPC-I PCM ROM", ROMInfo::Full, NULL};

	static const ROMInfo * const FULL_ROM_INFOS[] = {
		&CTRL_MT32_V1_04,
		&CTRL_MT32_V1_05,
		&CTRL_MT32_V1_06,
		&CTRL_MT32_V1_07,
		&CTRL_MT32_BLUER,
		&CTRL_MT32_V2_03,
		&CTRL_MT32_V2_04,
		&CTRL_MT32_V2_06,
		&CTRL_MT32_V2_07,
		&CTRL_CM32L_V1_00,
		&CTRL_CM32L_V1_02,
		&CTRL_CM32LN_V1_00,
		&PCM_MT32,
		&PCM_CM32L,
		NULL
	};
	static const ROMInfo * const PARTIAL_ROM_INFOS[] = {
		&CTRL_MT32_V1_04_A, &CTRL_MT32_V1_04_B,
		&CTRL_MT32_V1_05_A, &CTRL_MT32_V1_05_B,
		&CTRL_MT32_V1_06_A, &CTRL_MT32_V1_06_B,
		&CTRL_MT32_V1_07_A, &CTRL_MT32_V1_07_B,
		&CTRL_MT32_BLUER_A, &CTRL_MT32_BLUER_B,
		&PCM_MT32_L, &PCM_MT32_H,
		&PCM_CM32L_L, &PCM_CM32L_H,
		NULL
	};
	static const ROMInfo *ALL_ROM_INFOS[_CALC_ARRAY_LENGTH(FULL_ROM_INFOS) + _CALC_ARRAY_LENGTH(PARTIAL_ROM_INFOS) + 1];

	if (CTRL_MT32_V1_04_A.pairROMInfo == NULL) {
		CTRL_MT32_V1_04_A.pairROMInfo = &CTRL_MT32_V1_04_B;
		CTRL_MT32_V1_05_A.pairROMInfo = &CTRL_MT32_V1_05_B;
		CTRL_MT32_V1_06_A.pairROMInfo = &CTRL_MT32_V1_06_B;
		CTRL_MT32_V1_07_A.pairROMInfo = &CTRL_MT32_V1_07_B;
		CTRL_MT32_BLUER_A.pairROMInfo = &CTRL_MT32_BLUER_B;
		PCM_MT32_L.pairROMInfo = &PCM_MT32_H;
		PCM_CM32L_L.pairROMInfo = &PCM_CM32L_H;

		memcpy(&ALL_ROM_INFOS[0], FULL_ROM_INFOS, sizeof FULL_ROM_INFOS);
		memcpy(&ALL_ROM_INFOS[_CALC_ARRAY_LENGTH(FULL_ROM_INFOS)], PARTIAL_ROM_INFOS, sizeof PARTIAL_ROM_INFOS); // Includes NULL terminator.
	}

	static const ROMInfo * const MT32_V1_04_ROMS[] = {&CTRL_MT32_V1_04, &PCM_MT32, &CTRL_MT32_V1_04_A, &CTRL_MT32_V1_04_B, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V1_05_ROMS[] = {&CTRL_MT32_V1_05, &PCM_MT32, &CTRL_MT32_V1_05_A, &CTRL_MT32_V1_05_B, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V1_06_ROMS[] = {&CTRL_MT32_V1_06, &PCM_MT32, &CTRL_MT32_V1_06_A, &CTRL_MT32_V1_06_B, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V1_07_ROMS[] = {&CTRL_MT32_V1_07, &PCM_MT32, &CTRL_MT32_V1_07_A, &CTRL_MT32_V1_07_B, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_BLUER_ROMS[] = {&CTRL_MT32_BLUER, &PCM_MT32, &CTRL_MT32_BLUER_A, &CTRL_MT32_BLUER_B, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V2_03_ROMS[] = {&CTRL_MT32_V2_03, &PCM_MT32, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V2_04_ROMS[] = {&CTRL_MT32_V2_04, &PCM_MT32, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V2_06_ROMS[] = {&CTRL_MT32_V2_06, &PCM_MT32, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const MT32_V2_07_ROMS[] = {&CTRL_MT32_V2_07, &PCM_MT32, &PCM_MT32_L, &PCM_MT32_H, NULL};
	static const ROMInfo * const CM32L_V1_00_ROMS[] = {&CTRL_CM32L_V1_00, &PCM_CM32L, &PCM_CM32L_L, &PCM_CM32L_H, NULL};
	static const ROMInfo * const CM32L_V1_02_ROMS[] = {&CTRL_CM32L_V1_02, &PCM_CM32L, &PCM_CM32L_L, &PCM_CM32L_H, NULL};
	static const ROMInfo * const CM32LN_V1_00_ROMS[] = {&CTRL_CM32LN_V1_00, &PCM_CM32L, NULL};

	static const ROMInfoLists romInfoLists = {
		{MT32_V1_04_ROMS, _CALC_ARRAY_LENGTH(MT32_V1_04_ROMS)},
		{MT32_V1_05_ROMS, _CALC_ARRAY_LENGTH(MT32_V1_05_ROMS)},
		{MT32_V1_06_ROMS, _CALC_ARRAY_LENGTH(MT32_V1_06_ROMS)},
		{MT32_V1_07_ROMS, _CALC_ARRAY_LENGTH(MT32_V1_07_ROMS)},
		{MT32_BLUER_ROMS, _CALC_ARRAY_LENGTH(MT32_BLUER_ROMS)},
		{MT32_V2_03_ROMS, _CALC_ARRAY_LENGTH(MT32_V2_03_ROMS)},
		{MT32_V2_04_ROMS, _CALC_ARRAY_LENGTH(MT32_V2_04_ROMS)},
		{MT32_V2_06_ROMS, _CALC_ARRAY_LENGTH(MT32_V2_06_ROMS)},
		{MT32_V2_07_ROMS, _CALC_ARRAY_LENGTH(MT32_V2_07_ROMS)},
		{CM32L_V1_00_ROMS, _CALC_ARRAY_LENGTH(CM32L_V1_00_ROMS)},
		{CM32L_V1_02_ROMS, _CALC_ARRAY_LENGTH(CM32L_V1_02_ROMS)},
		{CM32LN_V1_00_ROMS, _CALC_ARRAY_LENGTH(CM32LN_V1_00_ROMS)},
		{FULL_ROM_INFOS, _CALC_ARRAY_LENGTH(FULL_ROM_INFOS)},
		{PARTIAL_ROM_INFOS, _CALC_ARRAY_LENGTH(PARTIAL_ROM_INFOS)},
		{ALL_ROM_INFOS, _CALC_ARRAY_LENGTH(ALL_ROM_INFOS)}
	};
	return romInfoLists;
}